

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# offline-ekf-flexibility-estimation.hxx
# Opt level: O1

IndexedVectorArray *
stateObservation::examples::offlineEKFFlexibilityEstimation
          (IndexedVectorArray *__return_storage_ptr__,IndexedVectorArray *y,Vector *xh0,
          uint numberOfContacts,
          vector<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_Eigen::aligned_allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
          *contactsPositions,double dt)

{
  _Map_pointer ppMVar1;
  long k;
  IndexedVectorArray u;
  void *local_b0 [2];
  undefined8 local_a0 [2];
  undefined8 local_90;
  IndexedMatrixArrayT<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_std::allocator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
  local_88;
  
  local_88.v_.
  super__Deque_base<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_std::allocator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
  ._M_impl.super__Deque_impl_data._M_finish._M_first = (_Elt_pointer)0x0;
  local_88.v_.
  super__Deque_base<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_std::allocator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
  ._M_impl.super__Deque_impl_data._M_finish._M_last = (_Elt_pointer)0x0;
  local_88.v_.
  super__Deque_base<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_std::allocator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
  ._M_impl.super__Deque_impl_data._M_start._M_node = (_Map_pointer)0x0;
  local_88.v_.
  super__Deque_base<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_std::allocator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
  ._M_impl.super__Deque_impl_data._M_finish._M_cur = (_Elt_pointer)0x0;
  local_88.v_.
  super__Deque_base<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_std::allocator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
  ._M_impl.super__Deque_impl_data._M_start._M_first = (_Elt_pointer)0x0;
  local_88.v_.
  super__Deque_base<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_std::allocator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
  ._M_impl.super__Deque_impl_data._M_start._M_last = (_Elt_pointer)0x0;
  local_88.v_.
  super__Deque_base<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_std::allocator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
  ._M_impl.super__Deque_impl_data._M_map_size = 0;
  local_88.v_.
  super__Deque_base<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_std::allocator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
  ._M_impl.super__Deque_impl_data._M_start._M_cur = (_Elt_pointer)0x0;
  local_88.k_ = 0;
  local_88.v_.
  super__Deque_base<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_std::allocator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
  ._M_impl.super__Deque_impl_data._M_map = (_Map_pointer)0x0;
  local_88.v_.
  super__Deque_base<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_std::allocator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
  ._M_impl.super__Deque_impl_data._M_finish._M_node = (_Map_pointer)0x0;
  std::
  _Deque_base<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_std::allocator<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>_>
  ::_M_initialize_map(&local_88.v_.
                       super__Deque_base<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_std::allocator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
                      ,0);
  for (k = y->k_ + -1;
      ppMVar1 = (y->v_).
                super__Deque_base<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_std::allocator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
                ._M_impl.super__Deque_impl_data._M_finish._M_node,
      k < (long)(((long)(y->v_).
                        super__Deque_base<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_std::allocator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
                        ._M_impl.super__Deque_impl_data._M_finish._M_cur -
                  (long)(y->v_).
                        super__Deque_base<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_std::allocator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
                        ._M_impl.super__Deque_impl_data._M_finish._M_first >> 4) + y->k_ +
                ((long)(y->v_).
                       super__Deque_base<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_std::allocator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
                       ._M_impl.super__Deque_impl_data._M_start._M_last -
                 (long)(y->v_).
                       super__Deque_base<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_std::allocator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
                       ._M_impl.super__Deque_impl_data._M_start._M_cur >> 4) +
                ((((ulong)((long)ppMVar1 -
                          (long)(y->v_).
                                super__Deque_base<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_std::allocator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
                                ._M_impl.super__Deque_impl_data._M_start._M_node) >> 3) - 1) +
                (ulong)(ppMVar1 == (_Map_pointer)0x0)) * 0x20); k = k + 1) {
    local_a0[0] = 0xf;
    local_90 = 0;
    Eigen::PlainObjectBase<Eigen::Matrix<double,-1,1,0,-1,1>>::
    PlainObjectBase<Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,_1,1,0,_1,1>>>
              ((PlainObjectBase<Eigen::Matrix<double,_1,1,0,_1,1>> *)local_b0,
               (DenseBase<Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
                *)local_a0);
    IndexedMatrixArrayT<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_std::allocator<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>_>
    ::setValue(&local_88,(Matrix<double,__1,_1,_0,__1,_1> *)local_b0,k);
    free(local_b0[0]);
  }
  offlineEKFFlexibilityEstimation
            (__return_storage_ptr__,y,&local_88,xh0,numberOfContacts,contactsPositions,0.0,
             (IndexedVectorArray *)0x0,(IndexedVectorArray *)0x0);
  std::
  deque<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_std::allocator<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>_>
  ::~deque(&local_88.v_);
  return __return_storage_ptr__;
}

Assistant:

stateObservation::IndexedVectorArray offlineEKFFlexibilityEstimation(
            const stateObservation::IndexedVectorArray & y,
            const Vector & xh0,
            unsigned numberOfContacts,
            const std::vector<Vector3, Eigen::aligned_allocator<Vector3> > & contactsPositions,
            double dt)
{
    const Index inputSize=15;

    ///initialization of a zero input
    stateObservation::IndexedVectorArray u;
    for (TimeIndex k=y.getFirstIndex()-1; k<y.getNextIndex(); ++k)
    {
        u.setValue(Vector::Zero(inputSize,1),k);
    }

    return offlineEKFFlexibilityEstimation
                        (y, u, xh0, numberOfContacts, contactsPositions, dt);
}